

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::freeFactorRings(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *this)

{
  Pring *pPVar1;
  
  pPVar1 = (this->temp).pivot_col;
  if (pPVar1 != (Pring *)0x0) {
    free(pPVar1);
    (this->temp).pivot_col = (Pring *)0x0;
  }
  pPVar1 = (this->temp).pivot_colNZ;
  if (pPVar1 != (Pring *)0x0) {
    free(pPVar1);
    (this->temp).pivot_colNZ = (Pring *)0x0;
  }
  pPVar1 = (this->temp).pivot_row;
  if (pPVar1 != (Pring *)0x0) {
    free(pPVar1);
    (this->temp).pivot_row = (Pring *)0x0;
  }
  pPVar1 = (this->temp).pivot_rowNZ;
  if (pPVar1 != (Pring *)0x0) {
    free(pPVar1);
    (this->temp).pivot_rowNZ = (Pring *)0x0;
  }
  return;
}

Assistant:

void CLUFactor<R>::freeFactorRings(void)
{

   if(temp.pivot_col)
      spx_free(temp.pivot_col);

   if(temp.pivot_colNZ)
      spx_free(temp.pivot_colNZ);

   if(temp.pivot_row)
      spx_free(temp.pivot_row);

   if(temp.pivot_rowNZ)
      spx_free(temp.pivot_rowNZ);
}